

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O0

int __thiscall Snes_Spc::cpu_read(Snes_Spc *this,int addr,rel_time_t time)

{
  uint time_00;
  uint addr_00;
  int in_EDX;
  int in_ESI;
  Snes_Spc *in_RDI;
  Timer *t;
  int reg;
  int result;
  Timer *local_20;
  
  addr_00 = (uint)(in_RDI->m).ram.ram[in_ESI];
  if ((-1 < in_ESI + -0xf0) && (0xfeff < in_ESI - 0x100U)) {
    time_00 = in_ESI - 0xfd;
    if (time_00 < 3) {
      local_20 = (in_RDI->m).timers + (int)time_00;
      if (local_20->next_time <= in_EDX) {
        local_20 = run_timer_(in_RDI,local_20,in_EDX);
      }
      addr_00 = local_20->counter;
      local_20->counter = 0;
    }
    else if ((int)time_00 < 0) {
      addr_00 = cpu_read_smp_reg((Snes_Spc *)CONCAT44(in_ESI,in_EDX),addr_00,time_00);
    }
    else {
      addr_00 = cpu_read((Snes_Spc *)CONCAT44(in_ESI,in_EDX),addr_00,time_00);
    }
  }
  return addr_00;
}

Assistant:

int Snes_Spc::cpu_read( int addr, rel_time_t time )
{
	MEM_ACCESS( time, addr )
	
	// RAM
	int result = RAM [addr];
	int reg = addr - 0xF0;
	if ( reg >= 0 ) // 40%
	{
		reg -= 0x10;
		if ( (unsigned) reg >= 0xFF00 ) // 21%
		{
			reg += 0x10 - r_t0out;
			
			// Timers
			if ( (unsigned) reg < timer_count ) // 90%
			{
				Timer* t = &m.timers [reg];
				if ( time >= t->next_time )
					t = run_timer_( t, time );
				result = t->counter;
				t->counter = 0;
			}
			// Other registers
			else if ( reg < 0 ) // 10%
			{
				result = cpu_read_smp_reg( reg + r_t0out, time );
			}
			else // 1%
			{
				assert( reg + (r_t0out + 0xF0 - 0x10000) < 0x100 );
				result = cpu_read( reg + (r_t0out + 0xF0 - 0x10000), time );
			}
		}
	}
	
	return result;
}